

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_get_attribute_count(exr_const_context_t_conflict ctxt,int part_index,int32_t *count)

{
  int32_t iVar1;
  exr_result_t eVar2;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar2 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar2;
    }
    iVar1 = (ctxt->parts[(uint)part_index]->attributes).num_attributes;
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    if (count == (int32_t *)0x0) {
      eVar2 = (*ctxt->standard_error)(ctxt,3);
      return eVar2;
    }
    *count = iVar1;
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_get_attribute_count (
    exr_const_context_t ctxt, int part_index, int32_t* count)
{
    int32_t cnt;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    cnt = part->attributes.num_attributes;
    if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);

    if (!count) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);
    *count = cnt;
    return EXR_ERR_SUCCESS;
}